

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool prvTidyAdjustCharEncoding(TidyDocImpl *doc,int encoding)

{
  ulong val;
  ulong val_00;
  ulong val_01;
  
  if ((uint)encoding < 0xe) {
    val_01 = (ulong)(uint)encoding;
    val = *(ulong *)(&DAT_00154558 + val_01 * 8);
    val_00 = *(ulong *)(&DAT_001545c8 + val_01 * 8);
    prvTidySetOptionInt(doc,TidyCharEncoding,val_01);
    prvTidySetOptionInt(doc,TidyInCharEncoding,val_00);
    prvTidySetOptionInt(doc,TidyOutCharEncoding,val);
  }
  return (uint)((uint)encoding < 0xe);
}

Assistant:

Bool  TY_(AdjustCharEncoding)( TidyDocImpl* doc, int encoding )
{
    int outenc = -1;
    int inenc = -1;
    
    switch( encoding )
    {
    case MACROMAN:
        inenc = MACROMAN;
        outenc = ASCII;
        break;

    case WIN1252:
        inenc = WIN1252;
        outenc = ASCII;
        break;

    case IBM858:
        inenc = IBM858;
        outenc = ASCII;
        break;

    case ASCII:
        inenc = LATIN1;
        outenc = ASCII;
        break;

    case LATIN0:
        inenc = LATIN0;
        outenc = ASCII;
        break;

    case RAW:
    case LATIN1:
    case UTF8:
#ifndef NO_NATIVE_ISO2022_SUPPORT
    case ISO2022:
#endif

    case UTF16LE:
    case UTF16BE:
    case UTF16:
    case SHIFTJIS:
    case BIG5:
        inenc = outenc = encoding;
        break;
    }

    if ( inenc >= 0 )
    {
        TY_(SetOptionInt)( doc, TidyCharEncoding, encoding );
        TY_(SetOptionInt)( doc, TidyInCharEncoding, inenc );
        TY_(SetOptionInt)( doc, TidyOutCharEncoding, outenc );
        return yes;
    }
    return no;
}